

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  uint uVar1;
  undefined1 *puVar2;
  uint64_t *hcode;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  exr_result_t eVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long *plVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint64_t i;
  uint64_t uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  undefined1 *puVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  uint8_t *outStart;
  ulong uVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  bool bVar42;
  bool bVar43;
  int xnBits;
  
  puVar40 = (undefined1 *)0x0;
  if (nRaw == 0) goto LAB_0010c8da;
  if (sparebytes != 0x1c001c || outsz < 0x14) {
    return 3;
  }
  puVar2 = (undefined1 *)((long)out + 0x14);
  puVar41 = (undefined1 *)(outsz + (long)out);
  lVar17 = (long)spare + 0x100010;
  uVar29 = 0;
  memset(spare,0,0x80008);
  do {
    plVar19 = (long *)((long)spare + (ulong)raw[uVar29] * 8);
    *plVar19 = *plVar19 + 1;
    uVar29 = uVar29 + 1;
  } while (nRaw != uVar29);
  hcode = (uint64_t *)((long)spare + 0x80008);
  uVar25 = 0xffffffff;
  do {
    uVar20 = (int)uVar25 + 1;
    uVar25 = (ulong)uVar20;
  } while (*(long *)((long)spare + uVar25 * 8) == 0);
  if (uVar20 < 0x10001) {
    plVar19 = (long *)((long)spare + (ulong)uVar20 * 8);
    uVar31 = 0;
    uVar39 = 0;
    uVar26 = uVar25;
    do {
      *(int *)((long)spare + uVar26 * 4 + 0x180018) = (int)uVar26;
      if (*plVar19 != 0) {
        *(long **)(lVar17 + uVar39 * 8) = plVar19;
        uVar39 = (ulong)((int)uVar39 + 1);
        uVar31 = uVar26 & 0xffffffff;
      }
      uVar26 = uVar26 + 1;
      plVar19 = plVar19 + 1;
    } while ((int)uVar26 != 0x10001);
    uVar10 = (int)uVar31 + 1;
  }
  else {
    uVar39 = 0;
    uVar10 = 1;
  }
  puVar3 = (ulong *)((long)spare + (ulong)uVar10 * 8);
  *puVar3 = 1;
  *(ulong **)((long)spare + uVar39 * 8 + 0x100010) = puVar3;
  uVar28 = (int)uVar39 + 1;
  uVar39 = (ulong)uVar28;
  if (1 < uVar28) {
    uVar31 = uVar39 - 2 >> 1;
    uVar26 = uVar31;
    do {
      puVar4 = *(ulong **)(lVar17 + uVar26 * 8);
      uVar15 = uVar26;
      while (uVar15 < uVar39 - 1 >> 1) {
        uVar37 = uVar15 * 2 + 2;
        puVar5 = *(ulong **)((long)spare + uVar15 * 0x10 + 0x100018);
        puVar6 = *(ulong **)((long)spare + uVar15 * 0x10 + 0x100020);
        uVar36 = uVar15 * 2 + 1;
        uVar34 = *puVar6;
        uVar7 = *puVar5;
        uVar14 = uVar37;
        if (uVar34 == uVar7) {
          uVar14 = uVar36;
        }
        if (puVar6 <= puVar5) {
          uVar14 = uVar37;
        }
        if (uVar34 <= uVar7) {
          uVar36 = uVar14;
        }
        *(undefined8 *)(lVar17 + uVar15 * 8) = *(undefined8 *)(lVar17 + uVar36 * 8);
        uVar15 = uVar36;
      }
      if (((uVar28 & 1) == 0) && (uVar15 == uVar31)) {
        *(undefined8 *)(lVar17 + uVar15 * 8) =
             *(undefined8 *)((long)spare + uVar15 * 0x10 + 0x100018);
        uVar15 = uVar15 * 2 + 1;
      }
      if (uVar26 < uVar15) {
        uVar37 = *puVar4;
        do {
          uVar36 = uVar15 - 1 >> 1;
          puVar5 = *(ulong **)(lVar17 + uVar36 * 8);
          if ((*puVar5 <= uVar37) && (puVar5 <= puVar4 || *puVar5 != uVar37)) break;
          *(ulong **)(lVar17 + uVar15 * 8) = puVar5;
          uVar15 = uVar36;
        } while (uVar26 < uVar36);
      }
      *(ulong **)(lVar17 + uVar15 * 8) = puVar4;
      bVar42 = uVar26 != 0;
      uVar26 = uVar26 - 1;
    } while (bVar42);
  }
  iVar12 = 0;
  memset(hcode,0,0x80008);
  if (1 < uVar28) {
    do {
      lVar8 = *(long *)((long)spare + 0x100010);
      puVar4 = *(ulong **)((long)spare + uVar39 * 8 + 0x100008);
      *(long *)((long)spare + uVar39 * 8 + 0x100008) = lVar8;
      uVar31 = (long)spare + ((uVar39 * 8 + 0x100008) - lVar17);
      lVar13 = (long)uVar31 >> 3;
      uVar26 = lVar13 - 1;
      if (uVar26 < 2) {
        uVar36 = 0;
      }
      else {
        uVar15 = 0;
        do {
          uVar37 = uVar15 * 2 + 2;
          puVar5 = *(ulong **)((long)spare + uVar15 * 0x10 + 0x100018);
          puVar6 = *(ulong **)((long)spare + uVar15 * 0x10 + 0x100020);
          uVar36 = uVar15 * 2 + 1;
          uVar34 = *puVar6;
          uVar7 = *puVar5;
          uVar14 = uVar37;
          if (uVar34 == uVar7) {
            uVar14 = uVar36;
          }
          if (puVar6 <= puVar5) {
            uVar14 = uVar37;
          }
          if (uVar34 <= uVar7) {
            uVar36 = uVar14;
          }
          *(undefined8 *)(lVar17 + uVar15 * 8) = *(undefined8 *)(lVar17 + uVar36 * 8);
          uVar15 = uVar36;
        } while (uVar36 < uVar26 >> 1);
      }
      if (((uVar31 & 8) == 0) && (uVar36 == lVar13 - 2U >> 1)) {
        *(undefined8 *)(lVar17 + uVar36 * 8) =
             *(undefined8 *)((long)spare + uVar36 * 0x10 + 0x100018);
        uVar36 = uVar36 * 2 + 1;
      }
      if (uVar36 != 0) {
        uVar26 = *puVar4;
        do {
          uVar31 = uVar36 - 1;
          uVar15 = uVar31 >> 1;
          puVar5 = *(ulong **)(lVar17 + uVar15 * 8);
          if ((*puVar5 <= uVar26) && (puVar5 <= puVar4 || *puVar5 != uVar26)) break;
          *(ulong **)(lVar17 + uVar36 * 8) = puVar5;
          uVar36 = uVar15;
        } while (1 < uVar31);
      }
      *(ulong **)((long)spare + uVar36 * 8 + 0x100010) = puVar4;
      uVar26 = uVar39 - 1;
      lVar13 = *(long *)((long)spare + 0x100010);
      lVar33 = uVar39 * 8 + -8 + lVar17;
      if (1 < uVar26) {
        puVar4 = *(ulong **)(lVar33 + -8);
        *(long *)(lVar33 + -8) = lVar13;
        uVar15 = (lVar33 + -8) - lVar17;
        lVar16 = (long)uVar15 >> 3;
        uVar31 = lVar16 - 1;
        if (uVar31 < 2) {
          uVar34 = 0;
        }
        else {
          uVar37 = 0;
          do {
            uVar36 = uVar37 * 2 + 2;
            puVar5 = *(ulong **)((long)spare + uVar37 * 0x10 + 0x100018);
            puVar6 = *(ulong **)((long)spare + uVar37 * 0x10 + 0x100020);
            uVar34 = uVar37 * 2 + 1;
            uVar7 = *puVar6;
            uVar14 = *puVar5;
            uVar27 = uVar36;
            if (uVar7 == uVar14) {
              uVar27 = uVar34;
            }
            if (puVar6 <= puVar5) {
              uVar27 = uVar36;
            }
            if (uVar7 <= uVar14) {
              uVar34 = uVar27;
            }
            *(undefined8 *)(lVar17 + uVar37 * 8) = *(undefined8 *)(lVar17 + uVar34 * 8);
            uVar37 = uVar34;
          } while (uVar34 < uVar31 >> 1);
        }
        if (((uVar15 & 8) == 0) && (uVar34 == lVar16 - 2U >> 1)) {
          *(undefined8 *)(lVar17 + uVar34 * 8) =
               *(undefined8 *)((long)spare + uVar34 * 0x10 + 0x100018);
          uVar34 = uVar34 * 2 + 1;
        }
        if (uVar34 != 0) {
          uVar31 = *puVar4;
          do {
            uVar15 = uVar34 - 1;
            uVar37 = uVar15 >> 1;
            puVar5 = *(ulong **)(lVar17 + uVar37 * 8);
            if ((*puVar5 <= uVar31) && (puVar5 <= puVar4 || *puVar5 != uVar31)) break;
            *(ulong **)(lVar17 + uVar34 * 8) = puVar5;
            uVar34 = uVar37;
          } while (1 < uVar15);
        }
        *(ulong **)(lVar17 + uVar34 * 8) = puVar4;
      }
      uVar31 = (ulong)(lVar8 - (long)spare) >> 3;
      uVar15 = (ulong)(lVar13 - (long)spare) >> 3;
      plVar19 = (long *)((long)spare + (uVar15 & 0xffffffff) * 8);
      *plVar19 = *plVar19 + *(long *)((long)spare + (uVar31 & 0xffffffff) * 8);
      puVar4 = *(ulong **)(lVar33 + -8);
      uVar39 = uVar39 - 2;
      if (uVar39 != 0) {
        uVar37 = *puVar4;
        do {
          uVar36 = uVar39 - 1;
          uVar34 = uVar36 >> 1;
          puVar5 = *(ulong **)(lVar17 + uVar34 * 8);
          if ((*puVar5 <= uVar37) && (puVar5 <= puVar4 || *puVar5 != uVar37)) break;
          *(ulong **)(lVar17 + uVar39 * 8) = puVar5;
          uVar39 = uVar34;
        } while (1 < uVar36);
      }
      *(ulong **)(lVar17 + uVar39 * 8) = puVar4;
      do {
        uVar24 = (uint)uVar15;
        uVar39 = uVar15 & 0xffffffff;
        plVar19 = (long *)((long)spare + uVar39 * 8 + 0x80008);
        *plVar19 = *plVar19 + 1;
        uVar28 = *(uint *)((long)spare + uVar39 * 4 + 0x180018);
        uVar15 = (ulong)uVar28;
      } while (uVar28 != uVar24);
      *(int *)((long)spare + uVar39 * 4 + 0x180018) = (int)uVar31;
      do {
        uVar24 = (uint)uVar31;
        plVar19 = (long *)((long)spare + (uVar31 & 0xffffffff) * 8 + 0x80008);
        *plVar19 = *plVar19 + 1;
        uVar28 = *(uint *)((long)spare + (uVar31 & 0xffffffff) * 4 + 0x180018);
        uVar31 = (ulong)uVar28;
      } while (uVar28 != uVar24);
      uVar39 = uVar26;
    } while (1 < uVar26);
  }
  hufCanonicalCodeTable(hcode);
  memcpy(spare,hcode,0x80008);
  uVar39 = 0;
  puVar40 = puVar2;
  if (uVar20 <= uVar10) {
    iVar12 = 0;
LAB_0010c284:
    uVar28 = (uint)uVar25;
    uVar26 = *(ulong *)((long)spare + uVar25 * 8) & 0x3f;
    if (uVar26 == 0) {
      uVar31 = 1;
      if (uVar28 < uVar10) {
        uVar15 = 1;
        while (uVar31 = uVar15, (*(byte *)((long)spare + uVar25 * 8 + 8) & 0x3f) == 0) {
          uVar25 = uVar25 + 1;
          uVar31 = uVar15 + 1;
          if ((uVar10 <= uVar25) || (bVar42 = 0x103 < uVar15, uVar15 = uVar31, bVar42)) break;
        }
        uVar28 = (uint)uVar25;
      }
      bVar42 = false;
      iVar23 = iVar12;
      if (1 < uVar31) {
        if (uVar31 < 6) {
          uVar39 = uVar31 + 0x39 | uVar39 << 6;
          iVar23 = iVar12 + 6;
          bVar42 = false;
          if (iVar12 < 2) goto LAB_0010c3c3;
          iVar21 = iVar12 + 0xe;
          iVar12 = iVar12 + -2;
          do {
            if (puVar41 <= puVar40) goto LAB_0010c42f;
            iVar23 = iVar23 + -8;
            *puVar40 = (char)(uVar39 >> ((byte)iVar12 & 0x3f));
            puVar40 = puVar40 + 1;
            iVar21 = iVar21 + -8;
            iVar12 = iVar12 + -8;
          } while (0xf < iVar21);
        }
        else {
          uVar39 = uVar39 << 6 | 0x3f;
          iVar21 = iVar12 + 6;
          if (1 < iVar12) {
            iVar12 = iVar12 + 0xe;
            do {
              iVar23 = iVar12;
              iVar21 = iVar21 + -8;
              if (puVar41 <= puVar40) {
                bVar42 = true;
                iVar23 = iVar23 + -8;
                goto LAB_0010c3c3;
              }
              *puVar40 = (char)(uVar39 >> ((byte)iVar21 & 0x3f));
              puVar40 = puVar40 + 1;
              iVar12 = iVar23 + -8;
            } while (0xf < iVar23 + -8);
            iVar21 = iVar23 + -0x10;
          }
          uVar39 = uVar31 - 6 | uVar39 << 8;
          iVar23 = iVar21 + 8;
          if (-1 < iVar21) {
            iVar12 = iVar21 + 0x10;
            do {
              if (puVar41 <= puVar40) goto LAB_0010c42f;
              iVar23 = iVar23 + -8;
              *puVar40 = (char)(uVar39 >> ((byte)iVar21 & 0x3f));
              puVar40 = puVar40 + 1;
              iVar12 = iVar12 + -8;
              iVar21 = iVar21 + -8;
            } while (0xf < iVar12);
          }
        }
        bVar42 = false;
      }
      goto LAB_0010c3c3;
    }
    goto LAB_0010c3cc;
  }
LAB_0010c254:
  bVar42 = true;
  eVar11 = 0;
  if (0 < iVar12) {
    if (puVar40 < puVar41) {
      *puVar40 = (char)(uVar39 << (8U - (char)iVar12 & 0x3f));
      puVar40 = puVar40 + 1;
      eVar11 = 0;
    }
    else {
      eVar11 = 4;
      bVar42 = false;
      puVar40 = puVar2;
    }
  }
LAB_0010c45d:
  if (!bVar42) {
    return eVar11;
  }
  uVar28 = (uint)*raw;
  uVar25 = *puVar3;
  bVar42 = nRaw != 1;
  puVar35 = puVar40;
  if (nRaw == 1) {
    uVar32 = 0;
    uVar24 = 0;
    uVar39 = 0;
  }
  else {
    uVar22 = (uint)uVar25 & 0x3f;
    uVar26 = 1;
    uVar39 = 0;
    bVar42 = true;
    uVar24 = 0;
    uVar32 = 0;
    do {
      uVar18 = (uint)raw[uVar26];
      if ((uVar32 == 0xff) || (uVar28 != uVar18)) {
        uVar31 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
        uVar30 = (uint)uVar31 & 0x3f;
        if ((int)(uVar22 + 8 + uVar30) < (int)(uVar30 * uVar32)) {
          uVar39 = uVar31 >> 6 | uVar39 << ((byte)uVar31 & 0x3f);
          uVar24 = uVar30 + uVar24;
          uVar30 = uVar24;
          if (7 < (int)uVar24) {
            do {
              if (puVar41 <= puVar35) {
                bVar43 = false;
                goto LAB_0010c671;
              }
              *puVar35 = (char)(uVar39 >> ((byte)(uVar30 - 8) & 0x3f));
              puVar35 = puVar35 + 1;
              uVar1 = uVar24 - 8;
              bVar43 = 0xf < (int)uVar24;
              uVar24 = uVar1;
              uVar30 = uVar30 - 8;
            } while (bVar43);
          }
          uVar39 = uVar39 << (sbyte)uVar22 | uVar25 >> 6;
          uVar30 = uVar24 + uVar22;
          uVar24 = uVar30;
          if (7 < (int)uVar30) {
            do {
              if (puVar41 <= puVar35) {
                bVar43 = false;
                uVar24 = uVar30;
                goto LAB_0010c671;
              }
              *puVar35 = (char)(uVar39 >> ((byte)(uVar24 - 8) & 0x3f));
              puVar35 = puVar35 + 1;
              uVar1 = uVar30 - 8;
              bVar43 = 0xf < (int)uVar30;
              uVar30 = uVar1;
              uVar24 = uVar24 - 8;
            } while (bVar43);
          }
          uVar39 = (long)(int)uVar32 | uVar39 << 8;
          uVar24 = uVar30 + 8;
          if ((int)uVar30 < 0) {
            bVar43 = true;
          }
          else {
            iVar12 = uVar30 + 0x10;
            do {
              bVar43 = puVar35 < puVar41;
              if (!bVar43) goto LAB_0010c671;
              uVar24 = uVar24 - 8;
              *puVar35 = (char)(uVar39 >> ((byte)uVar30 & 0x3f));
              puVar35 = puVar35 + 1;
              iVar12 = iVar12 + -8;
              uVar30 = uVar30 - 8;
            } while (0xf < iVar12);
          }
          uVar32 = 0;
          uVar28 = uVar18;
        }
        else {
          bVar43 = true;
          uVar30 = uVar32;
          if (-1 < (int)uVar32) {
            do {
              uVar32 = uVar30 - 1;
              uVar31 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
              uVar24 = ((uint)uVar31 & 0x3f) + uVar24;
              uVar39 = uVar31 >> 6 | uVar39 << ((byte)uVar31 & 0x3f);
              uVar38 = uVar24;
              uVar1 = uVar24;
              if (7 < (int)uVar24) {
                do {
                  if (puVar41 <= puVar35) {
                    bVar43 = false;
                    uVar24 = uVar38;
                    goto LAB_0010c671;
                  }
                  *puVar35 = (char)(uVar39 >> ((byte)(uVar1 - 8) & 0x3f));
                  puVar35 = puVar35 + 1;
                  uVar24 = uVar38 - 8;
                  bVar9 = 0xf < (int)uVar38;
                  uVar38 = uVar24;
                  uVar1 = uVar1 - 8;
                } while (bVar9);
              }
              bVar9 = 0 < (int)uVar30;
              uVar30 = uVar32;
            } while (bVar9);
          }
          uVar32 = 0;
          uVar28 = uVar18;
        }
      }
      else {
        uVar32 = uVar32 + 1;
        bVar43 = true;
      }
LAB_0010c671:
      if (!bVar43) break;
      uVar26 = uVar26 + 1;
      bVar42 = uVar26 < nRaw;
    } while (uVar26 != nRaw);
  }
  iVar12 = 4;
  if (!bVar42) {
    uVar26 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
    uVar22 = (uint)uVar26 & 0x3f;
    uVar30 = (uint)uVar25 & 0x3f;
    uVar18 = uVar30 + uVar22 + 8;
    nRaw = (uint64_t)uVar18;
    if ((int)uVar18 < (int)(uVar22 * uVar32)) {
      uVar39 = uVar26 >> 6 | uVar39 << ((byte)uVar26 & 0x3f);
      uVar22 = uVar22 + uVar24;
      if (7 < (int)uVar22) {
        nRaw = (uint64_t)uVar22;
        uVar28 = uVar22;
        do {
          nRaw = nRaw - 8;
          if (puVar41 <= puVar35) goto LAB_0010c85d;
          *puVar35 = (char)(uVar39 >> ((byte)nRaw & 0x3f));
          puVar35 = puVar35 + 1;
          uVar22 = uVar28 - 8;
          bVar42 = 0xf < (int)uVar28;
          uVar28 = uVar22;
        } while (bVar42);
      }
      nRaw = uVar25 & 0xffffffff;
      uVar25 = uVar25 >> 6 | uVar39 << ((byte)nRaw & 0x3f);
      uVar22 = uVar22 + uVar30;
      if (7 < (int)uVar22) {
        nRaw = (ulong)uVar22 - 8;
        uVar28 = uVar22;
        do {
          if (puVar41 <= puVar35) goto LAB_0010c85d;
          *puVar35 = (char)(uVar25 >> ((byte)nRaw & 0x3f));
          puVar35 = puVar35 + 1;
          uVar22 = uVar28 - 8;
          nRaw = nRaw - 8;
          bVar42 = 0xf < (int)uVar28;
          uVar28 = uVar22;
        } while (bVar42);
      }
      uVar39 = (long)(int)uVar32 | uVar25 << 8;
      uVar24 = uVar22 + 8;
      if (-1 < (int)uVar22) {
        nRaw = (ulong)uVar24 - 8;
        iVar23 = uVar22 + 0x10;
        do {
          iVar21 = iVar23;
          if (puVar41 <= puVar35) goto LAB_0010c85d;
          *puVar35 = (char)(uVar39 >> ((byte)nRaw & 0x3f));
          puVar35 = puVar35 + 1;
          iVar23 = iVar21 + -8;
          nRaw = nRaw - 8;
        } while (0xf < iVar23);
        uVar24 = iVar21 - 0x10;
      }
    }
    else if (-1 < (int)uVar32) {
      do {
        uVar25 = *(ulong *)((long)spare + (ulong)uVar28 * 8);
        uVar24 = ((uint)uVar25 & 0x3f) + uVar24;
        uVar39 = uVar25 >> 6 | uVar39 << ((byte)uVar25 & 0x3f);
        if (7 < (int)uVar24) {
          nRaw = (uint64_t)uVar24;
          uVar22 = uVar24;
          do {
            nRaw = nRaw - 8;
            if (puVar41 <= puVar35) goto LAB_0010c85d;
            *puVar35 = (char)(uVar39 >> ((byte)nRaw & 0x3f));
            puVar35 = puVar35 + 1;
            uVar24 = uVar22 - 8;
            bVar42 = 0xf < (int)uVar22;
            uVar22 = uVar24;
          } while (bVar42);
        }
        nRaw = (uint64_t)(uVar32 - 1);
        bVar42 = 0 < (int)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar42);
    }
    if (uVar24 != 0) {
      if (puVar41 <= puVar35) goto LAB_0010c85d;
      *puVar35 = (char)(uVar39 << (8U - (char)uVar24 & 0x3f));
    }
    nRaw = (long)(int)uVar24 + ((long)puVar35 - (long)puVar40) * 8;
    iVar12 = (uint)(nRaw >> 0x20 != 0) << 2;
  }
LAB_0010c85d:
  if (iVar12 != 0) {
    return iVar12;
  }
  *(char *)out = (char)uVar20;
  *(char *)((long)out + 1) = (char)(uVar20 >> 8);
  *(char *)((long)out + 2) = (char)(uVar20 >> 0x10);
  *(char *)((long)out + 3) = (char)(uVar20 >> 0x18);
  *(char *)((long)out + 4) = (char)uVar10;
  *(char *)((long)out + 5) = (char)(uVar10 >> 8);
  *(char *)((long)out + 6) = (char)(uVar10 >> 0x10);
  *(char *)((long)out + 7) = (char)(uVar10 >> 0x18);
  lVar17 = (long)puVar40 - (long)puVar2;
  *(char *)((long)out + 8) = (char)lVar17;
  *(char *)((long)out + 9) = (char)((ulong)lVar17 >> 8);
  *(char *)((long)out + 10) = (char)((ulong)lVar17 >> 0x10);
  *(char *)((long)out + 0xb) = (char)((ulong)lVar17 >> 0x18);
  *(char *)((long)out + 0xc) = (char)nRaw;
  *(char *)((long)out + 0xd) = (char)(nRaw >> 8);
  *(char *)((long)out + 0xe) = (char)(nRaw >> 0x10);
  *(char *)((long)out + 0xf) = (char)(nRaw >> 0x18);
  puVar40 = puVar40 + ((ulong)((int)nRaw + 7U >> 3) - (long)out);
  *(undefined4 *)((long)out + 0x10) = 0;
LAB_0010c8da:
  *encbytes = (uint64_t)puVar40;
  return 0;
LAB_0010c42f:
  bVar42 = true;
LAB_0010c3c3:
  iVar12 = iVar23;
  iVar23 = iVar12;
  if (uVar31 < 2) {
LAB_0010c3cc:
    uVar39 = uVar39 << 6 | uVar26;
    iVar23 = iVar12 + 6;
    bVar42 = false;
    if (1 < iVar12) {
      iVar21 = iVar12 + 0xe;
      iVar12 = iVar12 + -2;
      do {
        if (puVar41 <= puVar40) {
          bVar42 = true;
          goto LAB_0010c414;
        }
        iVar23 = iVar23 + -8;
        *puVar40 = (char)(uVar39 >> ((byte)iVar12 & 0x3f));
        puVar40 = puVar40 + 1;
        iVar21 = iVar21 + -8;
        iVar12 = iVar12 + -8;
      } while (0xf < iVar21);
      bVar42 = false;
    }
  }
LAB_0010c414:
  iVar12 = iVar23;
  if (bVar42) {
    eVar11 = 4;
    bVar42 = false;
    puVar40 = puVar2;
    goto LAB_0010c45d;
  }
  uVar25 = (ulong)(uVar28 + 1);
  if (uVar10 < uVar28 + 1) goto LAB_0010c254;
  goto LAB_0010c284;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*    freq;
    uint32_t*    hlink;
    uint64_t**   fHeap;
    uint64_t*    scode;
    uint32_t     im = 0;
    uint32_t     iM = 0;
    uint32_t     tableLength, nBits, dataLength;
    uint8_t*     dataStart;
    uint8_t*     compressed = (uint8_t*) out;
    uint8_t*     tableStart = compressed + 20;
    uint8_t*     tableEnd   = tableStart;
    uint8_t*     maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20) return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}